

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

void __thiscall
MutableBuffer::push<unsigned_short>(MutableBuffer *this,unsigned_short value,size_t count)

{
  unsigned_short *puVar1;
  unsigned_short local_32;
  ulong local_28;
  size_t i;
  size_t count_local;
  unsigned_short value_local;
  MutableBuffer *this_local;
  
  check_size(this,(this->super_Buffer).size + count * 2);
  for (local_28 = 0; local_28 < count; local_28 = local_28 + 1) {
    if ((this->super_Buffer).endianess == EndianessBig) {
      local_32 = htobe<unsigned_short>(value);
    }
    else {
      local_32 = htole<unsigned_short>(value);
    }
    puVar1 = (unsigned_short *)Buffer::offset(&this->super_Buffer,(this->super_Buffer).size);
    *puVar1 = local_32;
    (this->super_Buffer).size = (this->super_Buffer).size + 2;
  }
  return;
}

Assistant:

void push(T value, size_t count = 1) {
    check_size(size + (sizeof(T) * count));
    for (size_t i = 0; i < count; i++) {
      *(reinterpret_cast<T*>(offset(size))) = (endianess == EndianessBig) ?
                                                htobe(value) :
                                                htole(value);
      size += sizeof(T);
    }
  }